

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Write<float>(KDataStream *this,float T)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  KUINT8 i;
  long lVar16;
  undefined1 in_register_00001204 [12];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uchar local_1d;
  undefined4 local_1c;
  
  auVar17._4_12_ = in_register_00001204;
  auVar17._0_4_ = (uint)T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar17._0_13_;
    auVar6[0xe] = in_register_00001204[3];
    auVar7[0xc] = in_register_00001204[2];
    auVar7._0_12_ = auVar17._0_12_;
    auVar7._13_2_ = auVar6._13_2_;
    auVar8[0xb] = 0;
    auVar8._0_11_ = auVar17._0_11_;
    auVar8._12_3_ = auVar7._12_3_;
    auVar9[10] = in_register_00001204[1];
    auVar9._0_10_ = auVar17._0_10_;
    auVar9._11_4_ = auVar8._11_4_;
    auVar10[9] = 0;
    auVar10._0_9_ = auVar17._0_9_;
    auVar10._10_5_ = auVar9._10_5_;
    auVar11[8] = in_register_00001204[0];
    auVar11._0_8_ = auVar17._0_8_;
    auVar11._9_6_ = auVar10._9_6_;
    auVar13._7_8_ = 0;
    auVar13._0_7_ = auVar11._8_7_;
    auVar15._1_8_ = SUB158(auVar13 << 0x40,7);
    auVar15[0] = (char)((uint)T >> 0x18);
    auVar15._9_6_ = 0;
    auVar12[4] = (char)((uint)T >> 0x10);
    auVar12._0_4_ = T;
    auVar12._5_10_ = SUB1510(auVar15 << 0x30,5);
    auVar14._11_4_ = 0;
    auVar14._0_11_ = auVar12._4_11_;
    auVar18._3_12_ = SUB1512(auVar14 << 0x20,3);
    auVar18[2] = (char)((uint)T >> 8);
    auVar18[0] = SUB41(T,0);
    auVar18[1] = 0;
    auVar18[0xf] = 0;
    auVar18 = pshuflw(auVar18,auVar18,0x1b);
    sVar1 = auVar18._0_2_;
    sVar2 = auVar18._2_2_;
    auVar17[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar18[2] - (0xff < sVar2);
    auVar17[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[0] - (0xff < sVar1);
    sVar3 = auVar18._4_2_;
    auVar17[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[4] - (0xff < sVar3);
    sVar4 = auVar18._6_2_;
    auVar17[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar18[6] - (0xff < sVar4);
    sVar5 = auVar18._14_2_;
    auVar17._4_4_ = 0;
    auVar17[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[0] - (0xff < sVar1);
    auVar17[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar18[2] - (0xff < sVar2);
    auVar17[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[4] - (0xff < sVar3);
    auVar17[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar18[6] - (0xff < sVar4);
    sVar1 = auVar18._8_2_;
    auVar17[0xc] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[8] - (0xff < sVar1);
    sVar1 = auVar18._10_2_;
    auVar17[0xd] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[10] - (0xff < sVar1);
    sVar1 = auVar18._12_2_;
    auVar17[0xe] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[0xc] - (0xff < sVar1);
    auVar17[0xf] = (0 < sVar5) * (sVar5 < 0x100) * auVar18[0xe] - (0xff < sVar5);
  }
  local_1c = auVar17._0_4_;
  lVar16 = 0;
  do {
    local_1d = *(uchar *)((long)&local_1c + lVar16);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_1d);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}